

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O1

void __thiscall HostVector_copy_Test::TestBody(HostVector_copy_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *message;
  value_type_conflict2 v;
  AssertionResult gtest_ar;
  vecN<float,_32> v32;
  vecN<float,_16> v16;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  float local_8c;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pointer local_78;
  void *local_70;
  long lStack_68;
  AssertHelper local_58;
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  local_50;
  
  iVar3 = posix_memalign(&local_78,0x10,400);
  lVar4 = 0;
  local_50.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  .pointer_ = (pointer)0x0;
  if (iVar3 == 0) {
    local_50.
    super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
    .pointer_ = local_78;
  }
  local_50.
  super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  .size_ = 100;
  do {
    *(undefined4 *)
     ((long)local_50.
            super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
            .pointer_ + lVar4) = 0x4048f5c3;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
              *)&local_78,&local_50);
  pvVar1 = local_70;
  if (lStack_68 != 0) {
    lVar4 = 0;
    do {
      local_8c = *(float *)((long)pvVar1 + lVar4);
      local_98.ptr_._0_4_ = 0x4048f5c3;
      testing::internal::CmpHelperEQ<float,float>(local_88,"v","3.14f",&local_8c,(float *)&local_98)
      ;
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        message = "";
        if (local_80.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                   ,0x61,message);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_98.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_98.ptr_ + 8))();
          }
          local_98.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 4;
    } while (lStack_68 << 2 != lVar4);
  }
  if (local_70 != (void *)0x0) {
    free(local_70);
  }
  local_70 = (void *)0x0;
  lStack_68 = 0;
  if (local_50.
      super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
      .pointer_ != (pointer)0x0) {
    free(local_50.
         super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
         .pointer_);
  }
  return;
}

Assistant:

TEST(HostVector, copy) {
    using namespace memory;

    vecN<float, 16> v16(100);
    v16(memory::all) = 3.14f;
    vecN<float, 32> v32 = v16;

    for(auto v: v32) {
        EXPECT_EQ(v, 3.14f);
    }
}